

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

int check_multiple_option_occurrences
              (char *prog_name,uint option_given,uint min,uint max,char *option_desc)

{
  char *__format;
  ulong uVar1;
  
  if (option_given == 0) {
    return 0;
  }
  if (max == 0 && min == 0) {
    return 0;
  }
  if (min == 0 || max == 0) {
    if (min == 0) {
      if (option_given <= max || max == 0) {
        return 0;
      }
      __format = "%s: %s option occurrences must be at most %d\n";
      uVar1 = (ulong)max;
      goto LAB_0012ca44;
    }
    if (min <= option_given) {
      return 0;
    }
    __format = "%s: %s option occurrences must be at least %d\n";
  }
  else {
    if (min != max) {
      if ((min <= option_given) && (option_given <= max)) {
        return 0;
      }
      fprintf(_stderr,"%s: %s option occurrences must be between %d and %d\n",prog_name,option_desc,
              (ulong)min,(ulong)max);
      return 1;
    }
    if (option_given == min) {
      return 0;
    }
    __format = "%s: %s option occurrences must be %d\n";
  }
  uVar1 = (ulong)min;
LAB_0012ca44:
  fprintf(_stderr,__format,prog_name,option_desc,uVar1);
  return 1;
}

Assistant:

int
check_multiple_option_occurrences(const char *prog_name, unsigned int option_given, unsigned int min, unsigned int max, const char *option_desc)
{
  int error_occurred = 0;

  if (option_given && (min > 0 || max > 0))
    {
      if (min > 0 && max > 0)
        {
          if (min == max)
            {
              /* specific occurrences */
              if (option_given != (unsigned int) min)
                {
                  fprintf (stderr, "%s: %s option occurrences must be %d\n",
                    prog_name, option_desc, min);
                  error_occurred = 1;
                }
            }
          else if (option_given < (unsigned int) min
                || option_given > (unsigned int) max)
            {
              /* range occurrences */
              fprintf (stderr, "%s: %s option occurrences must be between %d and %d\n",
                prog_name, option_desc, min, max);
              error_occurred = 1;
            }
        }
      else if (min > 0)
        {
          /* at least check */
          if (option_given < min)
            {
              fprintf (stderr, "%s: %s option occurrences must be at least %d\n",
                prog_name, option_desc, min);
              error_occurred = 1;
            }
        }
      else if (max > 0)
        {
          /* at most check */
          if (option_given > max)
            {
              fprintf (stderr, "%s: %s option occurrences must be at most %d\n",
                prog_name, option_desc, max);
              error_occurred = 1;
            }
        }
    }
    
  return error_occurred;
}